

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O0

string * deqp::gles2::Performance::anon_unknown_1::FunctionCase::incrementExpr
                   (string *__return_storage_ptr__,string *baseExpr,DataType type,bool divide)

{
  bool bVar1;
  char *local_100;
  bool local_e2;
  bool local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c0;
  byte local_9a;
  byte local_99;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  allocator<char> local_41;
  undefined1 local_40 [8];
  string mulOrDiv;
  bool divide_local;
  DataType type_local;
  string *baseExpr_local;
  
  if (divide) {
    local_100 = "/";
  }
  else {
    local_100 = "*";
  }
  mulOrDiv.field_2._M_local_buf[0xb] = divide;
  mulOrDiv.field_2._12_4_ = type;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)local_40,local_100,&local_41);
  std::allocator<char>::~allocator(&local_41);
  bVar1 = glu::isDataTypeBoolOrBVec(mulOrDiv.field_2._12_4_);
  local_99 = 0;
  local_9a = 0;
  local_e1 = false;
  local_e2 = false;
  if (bVar1) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)baseExpr);
  }
  else {
    local_e2 = glu::isDataTypeIntOrIVec(mulOrDiv.field_2._12_4_);
    if (local_e2) {
      std::operator+(&local_98,"(",baseExpr);
      local_99 = 1;
      std::operator+(&local_78,&local_98,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      local_9a = 1;
      std::operator+(__return_storage_ptr__,&local_78,"(i+1))");
    }
    else {
      std::operator+(&local_e0,"(",baseExpr);
      std::operator+(&local_c0,&local_e0,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40);
      std::operator+(__return_storage_ptr__,&local_c0,"float(i+1))");
    }
    local_e1 = !local_e2;
    local_e2 = !local_e2;
  }
  if (local_e2) {
    std::__cxx11::string::~string((string *)&local_c0);
  }
  if (local_e1) {
    std::__cxx11::string::~string((string *)&local_e0);
  }
  if ((local_9a & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_78);
  }
  if ((local_99 & 1) != 0) {
    std::__cxx11::string::~string((string *)&local_98);
  }
  std::__cxx11::string::~string((string *)local_40);
  return __return_storage_ptr__;
}

Assistant:

string FunctionCase::incrementExpr (const string& baseExpr, glu::DataType type, bool divide)
{
	const string mulOrDiv = divide ? "/" : "*";

	return glu::isDataTypeBoolOrBVec(type)	? baseExpr
		 : glu::isDataTypeIntOrIVec(type)	? "(" + baseExpr + mulOrDiv + "(i+1))"
		 :									  "(" + baseExpr + mulOrDiv + "float(i+1))";
}